

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::data__common_float_or_param_type____float
          (LibraryEffectsLoader *this,float value)

{
  CommonEffectPointerArray *pCVar1;
  EffectCommon **ppEVar2;
  long in_RDI;
  float in_XMM0_Da;
  FloatOrParam *in_stack_fffffffffffffdd8;
  EffectCommon *IndexOfRefraction;
  EffectCommon *in_stack_fffffffffffffde0;
  EffectCommon *this_00;
  undefined8 in_stack_fffffffffffffde8;
  float val;
  FloatOrParam *in_stack_fffffffffffffdf0;
  undefined1 local_1e8 [488];
  
  val = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  switch(*(undefined4 *)(in_RDI + 0x188)) {
  case 4:
    pCVar1 = COLLADAFW::Effect::getCommonEffects(*(Effect **)(in_RDI + 0x28));
    COLLADAFW::ArrayPrimitiveType<COLLADAFW::EffectCommon_*>::back
              (&pCVar1->super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>);
    COLLADAFW::FloatOrParam::FloatOrParam(in_stack_fffffffffffffdf0,val);
    COLLADAFW::EffectCommon::setShininess(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    COLLADAFW::FloatOrParam::~FloatOrParam((FloatOrParam *)in_stack_fffffffffffffde0);
    break;
  default:
    break;
  case 6:
    pCVar1 = COLLADAFW::Effect::getCommonEffects(*(Effect **)(in_RDI + 0x28));
    ppEVar2 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::EffectCommon_*>::back
                        (&pCVar1->super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>);
    COLLADAFW::FloatOrParam::FloatOrParam
              ((FloatOrParam *)(local_1e8 + 0x98),(float)((ulong)*ppEVar2 >> 0x20));
    COLLADAFW::EffectCommon::setReflectivity(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    COLLADAFW::FloatOrParam::~FloatOrParam((FloatOrParam *)in_stack_fffffffffffffde0);
    break;
  case 8:
    COLLADAFW::FloatOrParam::setFloatValue((FloatOrParam *)(in_RDI + 0xe8),in_XMM0_Da);
    break;
  case 9:
    pCVar1 = COLLADAFW::Effect::getCommonEffects(*(Effect **)(in_RDI + 0x28));
    ppEVar2 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::EffectCommon_*>::back
                        (&pCVar1->super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>);
    IndexOfRefraction = *ppEVar2;
    this_00 = (EffectCommon *)local_1e8;
    COLLADAFW::FloatOrParam::FloatOrParam(in_stack_fffffffffffffdf0,val);
    COLLADAFW::EffectCommon::setIndexOfRefraction(this_00,(FloatOrParam *)IndexOfRefraction);
    COLLADAFW::FloatOrParam::~FloatOrParam((FloatOrParam *)this_00);
  }
  return true;
}

Assistant:

bool LibraryEffectsLoader::data__common_float_or_param_type____float( float value )
	{
		switch ( mCurrentShaderParameterType)
		{
		case SHADER_PARAMETER_SHININESS:
			mCurrentEffect->getCommonEffects().back()->setShininess(value);
			break;
		case SHADER_PARAMETER_REFLECTIVITY:
			mCurrentEffect->getCommonEffects().back()->setReflectivity(value);
			break;
		case SHADER_PARAMETER_INDEX_OF_REFRACTION:
			mCurrentEffect->getCommonEffects().back()->setIndexOfRefraction(value);
			break;
		case SHADER_PARAMETER_TRANSPARENCY:
			mTransparency.setFloatValue (value);
			break;
        default:
            break;
		}
        
		return true;
	}